

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

bool __thiscall hgdb::json::VarStmt::operator==(VarStmt *this,VarStmt *stmt)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint *puVar4;
  bool bVar5;
  bool local_34;
  bool stmt_uninitialized;
  bool self_uninitialized;
  VarStmt *stmt_local;
  VarStmt *this_local;
  
  uVar3 = std::__cxx11::string::empty();
  bVar2 = false;
  if ((uVar3 & 1) != 0) {
    bVar5 = std::optional::operator_cast_to_bool
                      ((optional *)&(this->super_Scope<hgdb::json::VarStmt>).line_num);
    bVar2 = true;
    if (bVar5) {
      puVar4 = std::optional<unsigned_int>::operator*
                         (&(this->super_Scope<hgdb::json::VarStmt>).line_num);
      bVar2 = *puVar4 == 0;
    }
  }
  uVar3 = std::__cxx11::string::empty();
  bVar5 = false;
  if ((uVar3 & 1) != 0) {
    bVar1 = std::optional::operator_cast_to_bool
                      ((optional *)&(stmt->super_Scope<hgdb::json::VarStmt>).line_num);
    bVar5 = true;
    if (bVar1) {
      puVar4 = std::optional<unsigned_int>::operator*
                         (&(stmt->super_Scope<hgdb::json::VarStmt>).line_num);
      bVar5 = *puVar4 == 0;
    }
  }
  if ((bVar2) || (bVar5)) {
    this_local._7_1_ = std::operator==(&this->var_,&stmt->var_);
  }
  else {
    bVar2 = Scope<hgdb::json::VarStmt>::operator==
                      (&this->super_Scope<hgdb::json::VarStmt>,
                       &stmt->super_Scope<hgdb::json::VarStmt>);
    local_34 = false;
    if (bVar2) {
      local_34 = std::operator==(&this->var_,&stmt->var_);
    }
    this_local._7_1_ = local_34;
  }
  return this_local._7_1_;
}

Assistant:

[[nodiscard]] bool operator==(const VarStmt &stmt) const {
        auto self_uninitialized = filename.empty() && (!line_num || (*line_num == 0));
        auto stmt_uninitialized =
            stmt.filename.empty() && (!stmt.line_num || (*stmt.line_num == 0));
        if (self_uninitialized || stmt_uninitialized) {
            return var_ == stmt.var_;
        } else {
            return Scope<VarStmt>::operator==(stmt) && var_ == stmt.var_;
        }
    }